

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_stereo_process
               (float *left,drmp3_uint8 *ist_pos,drmp3_uint8 *sfb,drmp3_uint8 *hdr,int *max_band,
               int mpeg2_sh)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float local_54;
  float local_48;
  float s;
  float kr;
  float kl;
  uint ipos;
  uint max_pos;
  uint i;
  int mpeg2_sh_local;
  int *max_band_local;
  drmp3_uint8 *hdr_local;
  drmp3_uint8 *sfb_local;
  drmp3_uint8 *ist_pos_local;
  float *left_local;
  
  uVar2 = 0x40;
  if ((hdr[1] & 8) != 0) {
    uVar2 = 7;
  }
  ist_pos_local = (drmp3_uint8 *)left;
  for (ipos = 0; sfb[ipos] != '\0'; ipos = ipos + 1) {
    bVar1 = ist_pos[ipos];
    uVar3 = (uint)bVar1;
    if ((max_band[(ulong)ipos % 3] < (int)ipos) && (uVar3 < uVar2)) {
      local_54 = 1.4142135;
      if ((hdr[3] & 0x20) == 0) {
        local_54 = 1.0;
      }
      if ((hdr[1] & 8) == 0) {
        s = 1.0;
        fVar4 = drmp3_L3_ldexp_q2(1.0,(uVar3 + 1 >> 1) << ((byte)mpeg2_sh & 0x1f));
        local_48 = fVar4;
        if ((bVar1 & 1) != 0) {
          local_48 = 1.0;
          s = fVar4;
        }
      }
      else {
        local_48 = drmp3_L3_stereo_process::g_pan[uVar3 * 2 + 1];
        s = drmp3_L3_stereo_process::g_pan[(ulong)bVar1 * 2];
      }
      drmp3_L3_intensity_stereo_band
                ((float *)ist_pos_local,(uint)sfb[ipos],s * local_54,local_48 * local_54);
    }
    else if ((hdr[3] & 0x20) != 0) {
      drmp3_L3_midside_stereo((float *)ist_pos_local,(uint)sfb[ipos]);
    }
    ist_pos_local = ist_pos_local + (long)(int)(uint)sfb[ipos] * 4;
  }
  return;
}

Assistant:

static void drmp3_L3_stereo_process(float *left, const drmp3_uint8 *ist_pos, const drmp3_uint8 *sfb, const drmp3_uint8 *hdr, int max_band[3], int mpeg2_sh)
{
    static const float g_pan[7*2] = { 0,1,0.21132487f,0.78867513f,0.36602540f,0.63397460f,0.5f,0.5f,0.63397460f,0.36602540f,0.78867513f,0.21132487f,1,0 };
    unsigned i, max_pos = DRMP3_HDR_TEST_MPEG1(hdr) ? 7 : 64;

    for (i = 0; sfb[i]; i++)
    {
        unsigned ipos = ist_pos[i];
        if ((int)i > max_band[i % 3] && ipos < max_pos)
        {
            float kl, kr, s = DRMP3_HDR_TEST_MS_STEREO(hdr) ? 1.41421356f : 1;
            if (DRMP3_HDR_TEST_MPEG1(hdr))
            {
                kl = g_pan[2*ipos];
                kr = g_pan[2*ipos + 1];
            } else
            {
                kl = 1;
                kr = drmp3_L3_ldexp_q2(1, (ipos + 1) >> 1 << mpeg2_sh);
                if (ipos & 1)
                {
                    kl = kr;
                    kr = 1;
                }
            }
            drmp3_L3_intensity_stereo_band(left, sfb[i], kl*s, kr*s);
        } else if (DRMP3_HDR_TEST_MS_STEREO(hdr))
        {
            drmp3_L3_midside_stereo(left, sfb[i]);
        }
        left += sfb[i];
    }
}